

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O3

void am_add_timing_event(Am_Interactor_Time_Event *new_event)

{
  bool bVar1;
  Am_Value *this;
  Am_Ptr pvVar2;
  Am_Time new_time;
  Am_Time local_20;
  
  Am_Time::Am_Time(&local_20,&new_event->next_timeout);
  Am_Value_List::Start(&am_timing_events);
  do {
    bVar1 = Am_Value_List::Last(&am_timing_events);
    if (bVar1) {
      Am_Value_List::Add(&am_timing_events,new_event,Am_TAIL,true);
LAB_001d49ae:
      Am_Time::~Am_Time(&local_20);
      return;
    }
    this = Am_Value_List::Get(&am_timing_events);
    pvVar2 = Am_Value::operator_cast_to_void_(this);
    bVar1 = Am_Time::operator>((Am_Time *)((long)pvVar2 + 0x18),&local_20);
    if (bVar1) {
      Am_Value_List::Insert(&am_timing_events,new_event,Am_BEFORE,true);
      goto LAB_001d49ae;
    }
    Am_Value_List::Next(&am_timing_events);
  } while( true );
}

Assistant:

static void
am_add_timing_event(Am_Interactor_Time_Event *new_event)
{
  Am_Interactor_Time_Event *e;
  Am_Time new_time = new_event->next_timeout;
  for (am_timing_events.Start(); !am_timing_events.Last();
       am_timing_events.Next()) {
    e = (Am_Interactor_Time_Event *)(Am_Ptr)(am_timing_events.Get());
    if (e->next_timeout > new_time) {
      am_timing_events.Insert((Am_Ptr)new_event, Am_BEFORE);
      return;
    }
  } // end for: if we get here, add to end of list.
  am_timing_events.Add((Am_Ptr)new_event, Am_TAIL);
}